

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

parser_token char_to_token(char c)

{
  parser_token pVar1;
  ushort **ppuVar2;
  undefined3 in_register_00000039;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000039,c);
  if (iVar3 == 10) {
    pVar1 = NEW_LINE;
  }
  else if (iVar3 == 0x22) {
    pVar1 = QUOTE;
  }
  else if (iVar3 == 0x23) {
    pVar1 = COMMENT_START;
  }
  else if (iVar3 == 0x24) {
    pVar1 = VARIABLE_START;
  }
  else if (iVar3 == 0x3d) {
    pVar1 = EQUAL;
  }
  else if (iVar3 == 0x5b) {
    pVar1 = ARRAY_START;
  }
  else if (iVar3 == 0x5d) {
    pVar1 = ARRAY_END;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[c] >> 0xb & 1) == 0) {
      pVar1 = ~(uint)(*ppuVar2)[c] >> 7 & UNKNOWN;
    }
    else {
      pVar1 = NUMERIC_CHAR;
    }
  }
  return pVar1;
}

Assistant:

enum parser_token char_to_token(char c)
{
        switch (c) {
        case '[':
                return ARRAY_START;
        case ']':
                return ARRAY_END;
        case '#':
                return COMMENT_START;
        case '=':
                return EQUAL;
        case '\n':
                return NEW_LINE;
        case '"':
                return QUOTE;
        case '$':
                return VARIABLE_START;
        default:
                if (isdigit(c)) {
                        return NUMERIC_CHAR;
                }

                if (isalpha(c)) {
                        return ALPHA_CHAR;
                }

                return UNKNOWN;
        }
}